

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double coupon_variance(int j,int type_num)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  if (j <= type_num) {
    iVar1 = 0;
    if (j < 1) {
      j = 0;
    }
    dVar3 = 0.0;
    iVar2 = 1;
    for (; -j != iVar1; iVar1 = iVar1 + -1) {
      dVar3 = dVar3 + (double)(iVar2 + -1) /
                      ((double)(type_num + iVar1) * (double)(type_num + iVar1));
      iVar2 = iVar2 + 1;
    }
    return dVar3 * (double)type_num;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"COUPON_VARIANCE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Number of distinct coupons desired must be no more\n");
  std::operator<<((ostream *)&std::cerr,"  than the total number of distinct coupons.\n");
  exit(1);
}

Assistant:

double coupon_variance ( int j, int type_num )

//****************************************************************************80
//
//  Purpose:
//
//    COUPON_VARIANCE returns the variance of the Coupon PDF.
//
//  Discussion:
//
//    In this version of the coupon collector's problem, we assume
//    that each box contains 1 coupon, that there are TYPE_NUM distinct types
//    of coupon, uniformly distributed among an inexhaustible supply
//    of boxes, and that the collector's goal is to get J distinct
//    types of coupons by opening one box after another.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    09 June 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int J, the number of distinct coupons to be collected.
//    J must be between 1 and N.
//
//    Input, int TYPE_NUM, the number of distinct coupons.
//
//    Output, double COUPON_VARIANCE, the variance of the number of
//    boxes that must be opened in order to just get J distinct kinds.
//
{
  int i;
  double variance;

  if ( type_num < j )
  {
    cerr << " \n";
    cerr << "COUPON_VARIANCE - Fatal error!\n";
    cerr << "  Number of distinct coupons desired must be no more\n";
    cerr << "  than the total number of distinct coupons.\n";
    exit ( 1 );
  }

  variance = 0.0;
  for ( i = 1; i <= j; i++ )
  {
    variance = variance + static_cast<double>(i - 1 ) /
      pow ( static_cast<double>(type_num - i + 1 ), 2 );
  }
  variance = variance * static_cast<double>(type_num );

  return variance;
}